

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

AVisitor<hiberlite::ExtractModel> * __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::operator&
          (AVisitor<hiberlite::ExtractModel> *this,
          collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
          *nvp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ExtractModel *this_00;
  pointer pcVar2;
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_68;
  
  this_00 = this->actor;
  paVar1 = &local_68.name.field_2;
  pcVar2 = (nvp->name)._M_dataplus._M_p;
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (nvp->name)._M_string_length);
  local_68.stream.ct = (nvp->stream).ct;
  local_68.stream.it._M_node = (nvp->stream).it._M_node;
  local_68.stream.xx.first = (nvp->stream).xx.first;
  local_68.stream.xx._4_4_ = *(undefined4 *)&(nvp->stream).xx.field_0x4;
  local_68.stream.xx.second = (nvp->stream).xx.second;
  ExtractModel::
  act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::pair<int,double>,hiberlite::stl_stream_adapter<std::pair<int,double>,std::set<std::pair<int,double>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>>>
            (this_00,this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(collection_nvp<E,S> nvp)
{
	actor->act(*this,nvp);
	return *this;
}